

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.inc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::OneofTest_EnumType_Test::OneofTest_EnumType_Test
          (OneofTest_EnumType_Test *this)

{
  OneofTest::OneofTest(&this->super_OneofTest);
  (this->super_OneofTest).super_Test._vptr_Test = (_func_int **)&PTR__Test_016507b8;
  return;
}

Assistant:

TEST_F(OneofTest, EnumType) {
  UNITTEST::TestOneof2 message;
  // Unset field returns default value
  EXPECT_EQ(message.foo_enum(), 1);

  message.set_foo_enum(UNITTEST::TestOneof2::FOO);
  EXPECT_TRUE(message.has_foo_enum());
  EXPECT_EQ(message.foo_enum(), UNITTEST::TestOneof2::FOO);
  message.clear_foo_enum();
  EXPECT_FALSE(message.has_foo_enum());
}